

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_232_11_d5d90c2a_for_proto *pp;
  uint *puVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode CVar10;
  int iVar11;
  uint uVar12;
  imapstate iVar13;
  CURLofft CVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  size_t sVar18;
  Curl_easy *pCVar19;
  char *pcVar20;
  byte *ptr;
  curl_off_t size;
  int imapcode;
  size_t nread;
  size_t local_68 [2];
  CURLcode local_54;
  ulong local_50;
  SASL *local_48;
  size_t local_40;
  char *local_38;
  
  sockfd = conn->sock[0];
  local_40 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar9;
  }
  local_48 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_54,&local_40);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_54 == ~CURLE_OK) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_54 == CURLE_OK) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (local_54 != CURLE_UNSUPPORTED_PROTOCOL) {
        pCVar19 = conn->data;
        if (local_54 != CURLE_URL_MALFORMAT) {
          Curl_failf(pCVar19,"Got unexpected imap-server response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (conn->proto).imapc.preauth = true;
        Curl_infof(pCVar19,"PREAUTH connection, already authenticated!\n");
      }
      *(undefined4 *)((long)&conn->proto + 0x84) = 0;
      *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
      (conn->proto).imapc.tls_supported = false;
      CVar9 = imap_sendf(conn,"CAPABILITY");
      iVar13 = IMAP_CAPABILITY;
LAB_00132214:
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      (conn->proto).imapc.state = iVar13;
      goto LAB_0013253b;
    case IMAP_CAPABILITY:
      pCVar19 = conn->data;
      if (local_54 == CURLE_UNSUPPORTED_PROTOCOL) {
        cVar3 = (pCVar19->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && ((conn->ssl[0].field_0x10 & 1) == 0)) {
          if ((conn->proto).imapc.tls_supported == true) {
            CVar9 = imap_sendf(conn,"STARTTLS");
            iVar13 = IMAP_STARTTLS;
            goto LAB_00132214;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            pcVar16 = "STARTTLS not supported.";
            goto LAB_00132776;
          }
        }
      }
      else if (local_54 == CURLE_ABORTED_BY_CALLBACK) {
        ptr = (byte *)((pCVar19->state).buffer + 2);
LAB_0013226b:
        do {
          uVar17 = (ulong)*ptr;
          if (uVar17 < 0x21) {
            if ((0x100002600U >> (uVar17 & 0x3f) & 1) != 0) {
              ptr = ptr + 1;
              goto LAB_0013226b;
            }
            if (uVar17 == 0) goto LAB_0013252e;
          }
          sVar18 = 0xfffffffffffffffb;
          while ((0x20 < (byte)uVar17 || ((0x100002601U >> (uVar17 & 0x3f) & 1) == 0))) {
            lVar6 = sVar18 + 6;
            sVar18 = sVar18 + 1;
            uVar17 = (ulong)ptr[lVar6];
          }
          uVar17 = sVar18 + 5;
          if (uVar17 == 7) {
            if (*(int *)(ptr + 3) != 0x52492d4c || *(int *)ptr != 0x4c534153) goto LAB_00132342;
            (conn->proto).imapc.ir_supported = true;
            uVar17 = 7;
          }
          else if (uVar17 == 0xd) {
            if (*(long *)(ptr + 5) != 0x44454c4241534944 || *(long *)ptr != 0x5349444e49474f4c)
            goto LAB_00132342;
            (conn->proto).imapc.login_disabled = true;
            uVar17 = 0xd;
          }
          else if (uVar17 == 8) {
            if (*(long *)ptr != 0x534c545452415453) goto LAB_00132342;
            (conn->proto).imapc.tls_supported = true;
            uVar17 = 8;
          }
          else if (5 < uVar17) {
LAB_00132342:
            if (ptr[4] == 0x3d && *(int *)ptr == 0x48545541) {
              ptr = ptr + 5;
              uVar12 = Curl_sasl_decode_mech((char *)ptr,sVar18,local_68);
              uVar17 = sVar18;
              if ((uVar12 != 0) && (local_68[0] == sVar18)) {
                puVar1 = (uint *)((long)&conn->proto + 0x84);
                *puVar1 = *puVar1 | uVar12;
              }
            }
          }
          ptr = ptr + uVar17;
        } while( true );
      }
LAB_0013251a:
      CVar10 = imap_perform_authentication(conn);
      break;
    case IMAP_STARTTLS:
      if (local_54 != CURLE_UNSUPPORTED_PROTOCOL) {
        pCVar19 = conn->data;
        if ((pCVar19->set).use_ssl != CURLUSESSL_TRY) {
          pcVar16 = "STARTTLS denied";
LAB_00132776:
          Curl_failf(pCVar19,pcVar16);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_0013251a;
      }
      CVar10 = imap_perform_upgrade_tls(conn);
      break;
    default:
      goto switchD_00132081_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar19 = conn->data;
      CVar10 = Curl_sasl_continue(local_48,conn,local_54,(saslprogress *)local_68);
      if (CVar10 == CURLE_OK) {
        if ((saslprogress)local_68[0] == SASL_IDLE) {
          if (((conn->proto).imapc.login_disabled == false) &&
             (((conn->proto).ftpc.cwdfail & 1U) != 0)) {
            CVar10 = imap_perform_login(conn);
          }
          else {
            Curl_failf(pCVar19,"Authentication cancelled");
            CVar10 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar10 = CURLE_OK;
          CVar9 = CURLE_OK;
          if ((saslprogress)local_68[0] == SASL_DONE) goto LAB_001324bf;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_54 != CURLE_UNSUPPORTED_PROTOCOL) {
        Curl_failf(conn->data,"Access denied. %c",(ulong)local_54);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_00132081_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      if (local_54 != CURLE_ABORTED_BY_CALLBACK) {
        CVar9 = CURLE_QUOTE_ERROR;
        goto joined_r0x00132722;
      }
      pcVar16 = (conn->data->state).buffer;
      sVar15 = strlen(pcVar16);
      pcVar16[sVar15] = '\n';
      CVar10 = Curl_client_write(conn,1,pcVar16,sVar15 + 1);
      pcVar16[sVar15] = '\0';
      break;
    case IMAP_SELECT:
      pCVar19 = conn->data;
      if (local_54 == CURLE_UNSUPPORTED_PROTOCOL) {
        pvVar4 = (pCVar19->req).protop;
        if (((*(char **)((long)pvVar4 + 0x10) != (char *)0x0) &&
            (pcVar16 = (conn->proto).imapc.mailbox_uidvalidity, pcVar16 != (char *)0x0)) &&
           (iVar11 = Curl_strcasecompare(*(char **)((long)pvVar4 + 0x10),pcVar16), iVar11 == 0)) {
          Curl_failf(conn->data,"Mailbox UIDVALIDITY has changed");
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
        pcVar16 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
        (conn->proto).imapc.mailbox = pcVar16;
        if (*(long *)((long)pvVar4 + 0x40) == 0) {
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            CVar10 = imap_perform_fetch(conn);
          }
          else {
            CVar10 = imap_perform_search(conn);
          }
        }
        else {
          CVar10 = imap_perform_list(conn);
        }
        break;
      }
      if (local_54 != CURLE_ABORTED_BY_CALLBACK) {
        Curl_failf(pCVar19,"Select failed");
        return CURLE_LOGIN_DENIED;
      }
      iVar11 = __isoc99_sscanf((pCVar19->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                               local_68);
      if (iVar11 == 1) {
        (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
        (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar16 = (*Curl_cstrdup)((char *)local_68);
        (conn->proto).imapc.mailbox_uidvalidity = pcVar16;
      }
      goto LAB_0013252e;
    case IMAP_FETCH:
      pCVar19 = conn->data;
      pcVar16 = (pCVar19->state).buffer;
      local_68[0] = 0;
      pcVar20 = pcVar16;
      if (local_54 == CURLE_ABORTED_BY_CALLBACK) {
        while( true ) {
          if (*pcVar16 == '\0') break;
          if (*pcVar16 == '{') {
            CVar14 = curlx_strtoofft(pcVar16 + 1,&local_38,10,(curl_off_t *)local_68);
            if ((((CVar14 == CURL_OFFT_OK) && (1 < (long)local_38 - (long)pcVar20)) &&
                (*local_38 == '}')) && ((local_38[1] == '\r' && (local_38[2] == '\0')))) {
              Curl_infof(pCVar19,"Found %ld bytes to download\n",local_68[0]);
              Curl_pgrsSetDownloadSize(pCVar19,local_68[0]);
              pcVar16 = (pp->ftpc).pp.cache;
              if (pcVar16 != (char *)0x0) {
                uVar17 = (conn->proto).ftpc.pp.cache_size;
                sVar18 = local_68[0];
                if (uVar17 < local_68[0]) {
                  sVar18 = uVar17;
                }
                if (sVar18 == 0) {
                  CVar9 = CURLE_OK;
                  goto LAB_001324bf;
                }
                local_50 = sVar18;
                CVar10 = Curl_client_write(conn,1,pcVar16,sVar18);
                uVar17 = local_50;
                if (CVar10 != CURLE_OK) goto LAB_00132525;
                pcVar2 = &(pCVar19->req).bytecount;
                *pcVar2 = *pcVar2 + local_50;
                Curl_infof(pCVar19,"Written %zu bytes, %lu bytes are left for transfer\n",local_50);
                uVar7 = local_50;
                uVar5 = (conn->proto).ftpc.pp.cache_size;
                sVar15 = uVar5 - uVar17;
                if (uVar5 < uVar17 || sVar15 == 0) {
                  (*Curl_cfree)((pp->ftpc).pp.cache);
                  (pp->ftpc).pp.cache = (char *)0x0;
                  sVar18 = 0;
                }
                else {
                  memmove((conn->proto).rtmp,(void *)((long)(conn->proto).rtmp + local_50),sVar15);
                  sVar18 = (conn->proto).ftpc.pp.cache_size - uVar7;
                }
                (conn->proto).ftpc.pp.cache_size = sVar18;
              }
              if ((pCVar19->req).bytecount == local_68[0]) {
                iVar11 = -1;
                sVar18 = 0xffffffffffffffff;
              }
              else {
                (pCVar19->req).maxdownload = local_68[0];
                iVar11 = 0;
                sVar18 = local_68[0];
              }
              Curl_setup_transfer(pCVar19,iVar11,sVar18,false,-1);
              CVar9 = CURLE_OK;
              goto LAB_001324bf;
            }
            break;
          }
          pcVar16 = pcVar16 + 1;
          pcVar20 = pcVar20 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar19,-1);
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_001324bf:
      CVar10 = CVar9;
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
joined_r0x00132722:
      if (local_54 != CURLE_UNSUPPORTED_PROTOCOL) {
        return CVar9;
      }
      goto switchD_00132081_caseD_4;
    case IMAP_APPEND:
      if (local_54 == CURLE_BAD_FUNCTION_ARGUMENT) {
        pCVar19 = conn->data;
        Curl_pgrsSetUploadSize(pCVar19,(pCVar19->state).infilesize);
        Curl_setup_transfer(pCVar19,-1,-1,false,0);
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      }
      return CURLE_UPLOAD_FAILED;
    case IMAP_APPEND_FINAL:
      if (local_54 != CURLE_UNSUPPORTED_PROTOCOL) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_00132081_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    }
LAB_00132525:
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
LAB_0013252e:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_0013253b:
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}